

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O2

void __thiscall Assimp::MDLImporter::HandleMaterialReferences_3DGS_MDL7(MDLImporter *this)

{
  ulong uVar1;
  aiMaterial *this_00;
  aiReturn aVar2;
  uint uVar3;
  ulong in_RAX;
  uint a;
  ulong uVar4;
  ulong uVar5;
  aiScene *paVar6;
  ulong uVar7;
  ulong uStack_38;
  int iIndex;
  
  uStack_38 = in_RAX;
  for (uVar7 = 0; uVar7 < this->pScene->mNumMaterials; uVar7 = uVar7 + 1) {
    uStack_38 = uStack_38 & 0xffffffff;
    aVar2 = aiGetMaterialInteger(this->pScene->mMaterials[uVar7],"&&&referrer&&&",0,0,&iIndex);
    if (aVar2 == aiReturn_SUCCESS) {
      for (uVar4 = 0; paVar6 = this->pScene, uVar4 < paVar6->mNumMeshes; uVar4 = uVar4 + 1) {
        if (uVar7 == paVar6->mMeshes[uVar4]->mMaterialIndex) {
          paVar6->mMeshes[uVar4]->mMaterialIndex = iIndex;
        }
      }
      this_00 = paVar6->mMaterials[uVar7];
      if (this_00 != (aiMaterial *)0x0) {
        aiMaterial::~aiMaterial(this_00);
      }
      operator_delete(this_00,0x10);
      paVar6 = this->pScene;
      uVar4 = uVar7;
      while (uVar3 = paVar6->mNumMaterials - 1, uVar4 < uVar3) {
        uVar1 = uVar4 + 1;
        paVar6->mMaterials[uVar4] = paVar6->mMaterials[uVar4 + 1];
        for (uVar5 = 0; paVar6 = this->pScene, uVar4 = uVar1, uVar5 < paVar6->mNumMeshes;
            uVar5 = uVar5 + 1) {
          uVar3 = paVar6->mMeshes[uVar5]->mMaterialIndex;
          if (uVar7 < uVar3) {
            paVar6->mMeshes[uVar5]->mMaterialIndex = uVar3 - 1;
          }
        }
      }
      paVar6->mNumMaterials = uVar3;
    }
  }
  return;
}

Assistant:

void MDLImporter::HandleMaterialReferences_3DGS_MDL7()
{
    // search for referrer materials
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i) {
        int iIndex = 0;
        if (AI_SUCCESS == aiGetMaterialInteger(pScene->mMaterials[i],AI_MDL7_REFERRER_MATERIAL, &iIndex) )  {
            for (unsigned int a = 0; a < pScene->mNumMeshes;++a)    {
                aiMesh* const pcMesh = pScene->mMeshes[a];
                if (i == pcMesh->mMaterialIndex) {
                    pcMesh->mMaterialIndex = iIndex;
                }
            }
            // collapse the rest of the array
            delete pScene->mMaterials[i];
            for (unsigned int pp = i; pp < pScene->mNumMaterials-1;++pp)    {

                pScene->mMaterials[pp] = pScene->mMaterials[pp+1];
                for (unsigned int a = 0; a < pScene->mNumMeshes;++a)    {
                    aiMesh* const pcMesh = pScene->mMeshes[a];
                    if (pcMesh->mMaterialIndex > i)--pcMesh->mMaterialIndex;
                }
            }
            --pScene->mNumMaterials;
        }
    }
}